

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall TorControlConnection::~TorControlConnection(TorControlConnection *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->b_conn != (bufferevent *)0x0) {
    bufferevent_free();
  }
  std::
  deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
  ::~deque(&this->reply_handlers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->message).lines);
  std::_Function_base::~_Function_base(&(this->disconnected).super__Function_base);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::_Function_base::~_Function_base((_Function_base *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TorControlConnection::~TorControlConnection()
{
    if (b_conn)
        bufferevent_free(b_conn);
}